

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter_inl.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_help
          (string *__return_storage_ptr__,Formatter *this,App *app,string *name,AppFormatMode mode)

{
  size_t sVar1;
  bool bVar2;
  ulong uVar3;
  App *pAVar4;
  string *psVar5;
  ostream *poVar6;
  allocator local_2f1;
  string local_2f0;
  string local_2d0;
  string local_2b0 [32];
  string local_290;
  string local_270 [32];
  string local_250 [32];
  string local_230 [39];
  allocator local_209;
  string local_208;
  string local_1e8;
  stringstream local_1b8 [8];
  stringstream out;
  ostream local_1a8 [383];
  AppFormatMode local_29;
  string *psStack_28;
  AppFormatMode mode_local;
  string *name_local;
  App *app_local;
  Formatter *this_local;
  
  local_29 = mode;
  psStack_28 = name;
  name_local = (string *)app;
  app_local = (App *)this;
  this_local = (Formatter *)__return_storage_ptr__;
  if (mode == Sub) {
    (*(this->super_FormatterBase)._vptr_FormatterBase[7])(__return_storage_ptr__,this,app,2);
  }
  else {
    ::std::__cxx11::stringstream::stringstream(local_1b8);
    App::get_name_abi_cxx11_((App *)name_local);
    uVar3 = ::std::__cxx11::string::empty();
    if (((uVar3 & 1) != 0) && (pAVar4 = App::get_parent((App *)name_local), pAVar4 != (App *)0x0)) {
      psVar5 = App::get_group_abi_cxx11_((App *)name_local);
      bVar2 = ::std::operator!=(psVar5,"SUBCOMMANDS");
      if (bVar2) {
        psVar5 = App::get_group_abi_cxx11_((App *)name_local);
        poVar6 = ::std::operator<<(local_1a8,(string *)psVar5);
        ::std::operator<<(poVar6,':');
      }
    }
    (*(this->super_FormatterBase)._vptr_FormatterBase[9])(&local_1e8,this,name_local);
    sVar1 = (this->super_FormatterBase).description_paragraph_width_;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_208,"",&local_209);
    detail::streamOutAsParagraph((ostream *)local_1a8,&local_1e8,sVar1,&local_208,false);
    ::std::__cxx11::string::~string((string *)&local_208);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_209);
    ::std::__cxx11::string::~string((string *)&local_1e8);
    psVar5 = name_local;
    ::std::__cxx11::string::string(local_250,(string *)name);
    (*(this->super_FormatterBase)._vptr_FormatterBase[10])(local_230,this,psVar5,local_250);
    ::std::operator<<(local_1a8,local_230);
    ::std::__cxx11::string::~string(local_230);
    ::std::__cxx11::string::~string(local_250);
    (*(this->super_FormatterBase)._vptr_FormatterBase[4])(local_270,this,name_local);
    ::std::operator<<(local_1a8,local_270);
    ::std::__cxx11::string::~string(local_270);
    make_groups_abi_cxx11_(&local_290,this,(App *)name_local,local_29);
    ::std::operator<<(local_1a8,(string *)&local_290);
    ::std::__cxx11::string::~string((string *)&local_290);
    (*(this->super_FormatterBase)._vptr_FormatterBase[5])(local_2b0,this,name_local,(ulong)local_29)
    ;
    ::std::operator<<(local_1a8,local_2b0);
    ::std::__cxx11::string::~string(local_2b0);
    (*(this->super_FormatterBase)._vptr_FormatterBase[8])(&local_2d0,this,name_local);
    sVar1 = (this->super_FormatterBase).footer_paragraph_width_;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_2f0,"",&local_2f1);
    detail::streamOutAsParagraph((ostream *)local_1a8,&local_2d0,sVar1,&local_2f0,false);
    ::std::__cxx11::string::~string((string *)&local_2f0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    ::std::__cxx11::string::~string((string *)&local_2d0);
    ::std::__cxx11::stringstream::str();
    ::std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_help(const App *app, std::string name, AppFormatMode mode) const {
    // This immediately forwards to the make_expanded method. This is done this way so that subcommands can
    // have overridden formatters
    if(mode == AppFormatMode::Sub)
        return make_expanded(app, mode);

    std::stringstream out;
    if((app->get_name().empty()) && (app->get_parent() != nullptr)) {
        if(app->get_group() != "SUBCOMMANDS") {
            out << app->get_group() << ':';
        }
    }

    detail::streamOutAsParagraph(
        out, make_description(app), description_paragraph_width_, "");  // Format description as paragraph
    out << make_usage(app, name);
    out << make_positionals(app);
    out << make_groups(app, mode);
    out << make_subcommands(app, mode);
    detail::streamOutAsParagraph(out, make_footer(app), footer_paragraph_width_);  // Format footer as paragraph

    return out.str();
}